

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::SymbolTable::compress_var(SymbolTable *this)

{
  pointer puVar1;
  reference pvVar2;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  undefined8 *puVar3;
  pointer puVar4;
  undefined1 local_110 [8];
  VarAssign var_assign;
  ulong local_b8;
  undefined1 local_b0 [8];
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ids;
  VariableCount v_count;
  size_type id;
  
  v_count.super_ScopeVisitor._vptr_ScopeVisitor =
       (_func_int **)&v_count.count._M_h._M_rehash_policy._M_next_resize;
  ids._M_h._M_single_bucket = (__node_base_ptr)&PTR_handle_002d1748;
  v_count.count._M_h._M_buckets = (__buckets_ptr)0x1;
  v_count.count._M_h._M_bucket_count = 0;
  v_count.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v_count.count._M_h._M_element_count._0_4_ = 0x3f800000;
  v_count.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v_count.count._M_h._M_rehash_policy._4_4_ = 0;
  v_count.count._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->modules_).
                super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    ScopeVisitor::visit((ScopeVisitor *)&ids._M_h._M_single_bucket,
                        (ScopeBase *)
                        (puVar4->_M_t).
                        super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                        .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
  }
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::reserve
            (&this->variables_,(size_type)v_count.count._M_h._M_before_begin._M_nxt);
  local_b0 = (undefined1  [8])&ids._M_h._M_rehash_policy._M_next_resize;
  ids._M_h._M_buckets = (__buckets_ptr)0x1;
  ids._M_h._M_bucket_count = 0;
  ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ids._M_h._M_element_count._0_4_ = 0x3f800000;
  ids._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ids._M_h._M_rehash_policy._4_4_ = 0;
  ids._M_h._M_rehash_policy._M_next_resize = 0;
  for (puVar3 = (undefined8 *)v_count.count._M_h._M_bucket_count; puVar3 != (undefined8 *)0x0;
      puVar3 = (undefined8 *)*puVar3) {
    std::pair<const_hgdb::json::Variable,_unsigned_long>::pair
              ((pair<const_hgdb::json::Variable,_unsigned_long> *)local_110,
               (pair<const_hgdb::json::Variable,_unsigned_long> *)(puVar3 + 1));
    if (1 < local_b8) {
      v_count.count._M_h._M_single_bucket =
           (__node_base_ptr)
           (((long)(this->variables_).
                   super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->variables_).
                  super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x58);
      pvVar2 = std::vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>>::
               emplace_back<hgdb::json::Variable_const&>
                         ((vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>> *)
                          &this->variables_,(Variable *)local_110);
      (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)v_count.count._M_h._M_single_bucket;
      (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
      std::
      _Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<hgdb::json::Variable&,unsigned_long&>
                ((_Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_b0,pvVar2,&v_count.count._M_h._M_single_bucket);
    }
    Variable::~Variable((Variable *)local_110);
  }
  local_110 = (undefined1  [8])&PTR_handle_002d1798;
  var_assign.super_ScopeVisitor._vptr_ScopeVisitor = (_func_int **)local_b0;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->modules_).
                super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    ScopeVisitor::visit((ScopeVisitor *)local_110,
                        (ScopeBase *)
                        (puVar4->_M_t).
                        super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                        .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
  }
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_b0);
  VariableCount::~VariableCount((VariableCount *)&ids._M_h._M_single_bucket);
  return;
}

Assistant:

void compress_var() {
        // first pass collect all the variables
        VariableCount v_count;
        for (auto &m : modules_) {
            v_count.visit(m.get());
        }
        // compute the global variable pull
        variables_.reserve(v_count.count.size());
        std::unordered_map<Variable, uint64_t, Variable::hash_fn> ids;
        for (auto [var, c] : v_count.count) {
            if (c > 1) {
                auto id = variables_.size();
                auto &var_id = variables_.emplace_back(var);
                var_id.id = id;
                ids.emplace(var_id, id);
            }
        }

        // second pass to assign
        VarAssign var_assign(ids);
        for (auto &m : modules_) {
            var_assign.visit(m.get());
        }
    }